

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditIconButton::paintEvent(QLineEditIconButton *this,QPaintEvent *param_2)

{
  double dVar1;
  bool bVar2;
  QLineEditPrivate *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int iconWidth;
  QLineEditPrivate *lep;
  Mode state;
  QRect pixmapRect;
  QPixmap iconPixmap;
  QSize iconSize;
  QPainter painter;
  undefined1 *puVar4;
  QLineEditIconButton *in_stack_ffffffffffffff10;
  QPoint *this_00;
  QAbstractButton *in_stack_ffffffffffffff18;
  QSize *asize;
  QLineEditPrivate *in_stack_ffffffffffffff28;
  QWidget *this_01;
  QRect *this_02;
  QPainter *this_03;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QPoint local_40;
  QWidgetData *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QSize local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_10,(QPaintDevice *)(in_RDI + 0x10));
  bVar2 = QWidget::isEnabled((QWidget *)0x5d3012);
  if (bVar2) {
    QAbstractButton::isDown((QAbstractButton *)in_stack_ffffffffffffff10);
  }
  pQVar3 = lineEditPrivate(in_stack_ffffffffffffff10);
  if (pQVar3 != (QLineEditPrivate *)0x0) {
    QLineEditPrivate::sideWidgetParameters(in_stack_ffffffffffffff28);
  }
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  asize = &local_18;
  QSize::QSize((QSize *)in_stack_ffffffffffffff10,-0x55555556,-0x55555556);
  local_38 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_40;
  local_28 = puVar4;
  QAbstractButton::icon(in_stack_ffffffffffffff18);
  dVar1 = (double)QPaintDevice::devicePixelRatio();
  this_02 = (QRect *)&local_38;
  QIcon::pixmap((QSize *)this_02,dVar1,(Mode)this_00,(State)asize);
  QIcon::~QIcon((QIcon *)this_00);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint(this_00,(int)((ulong)puVar4 >> 0x20),(int)puVar4);
  this_01 = (QWidget *)&local_58;
  QRect::QRect(this_02,(QPoint *)this_01,asize);
  QWidget::rect(this_01);
  QRect::center(this_02);
  QRect::moveCenter((QRect *)this_01,(QPoint *)asize);
  this_03 = (QPainter *)&local_10;
  QPainter::setOpacity(*(double *)(in_RDI + 0x28));
  QPainter::drawPixmap(this_03,this_02,(QPixmap *)this_01);
  QPixmap::~QPixmap((QPixmap *)this_02);
  QPainter::~QPainter(this_03);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditIconButton::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    QIcon::Mode state = QIcon::Disabled;
    if (isEnabled())
        state = isDown() ? QIcon::Active : QIcon::Normal;
    const QLineEditPrivate *lep = lineEditPrivate();
    const int iconWidth = lep ? lep->sideWidgetParameters().iconSize : 16;
    const QSize iconSize(iconWidth, iconWidth);
    const QPixmap iconPixmap = icon().pixmap(iconSize, devicePixelRatio(), state, QIcon::Off);
    QRect pixmapRect = QRect(QPoint(0, 0), iconSize);
    pixmapRect.moveCenter(rect().center());
    painter.setOpacity(m_opacity);
    painter.drawPixmap(pixmapRect, iconPixmap);
}